

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O3

void __thiscall
QColumnView::currentChanged(QColumnView *this,QModelIndex *current,QModelIndex *previous)

{
  QColumnViewPrivate *this_00;
  char cVar1;
  int iVar2;
  QAbstractItemModel *pQVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  int local_78;
  int iStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  QAbstractItemModel *local_68;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (current->m).ptr;
  if ((current->c | current->r) < 0 || pQVar3 == (QAbstractItemModel *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QAbstractItemView::currentChanged((QAbstractItemView *)this,current,previous);
      return;
    }
  }
  else {
    this_00 = *(QColumnViewPrivate **)
               &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget
                .field_0x8;
    local_68 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = -0x55555556;
    iStack_74 = -0x55555556;
    uStack_70 = 0xaaaaaaaa;
    uStack_6c = 0xaaaaaaaa;
    (**(code **)(*(long *)pQVar3 + 0x68))(&local_78,pQVar3,current);
    pQVar3 = (previous->m).ptr;
    if (pQVar3 == (QAbstractItemModel *)0x0) {
      local_58.r = -1;
      local_58.c = -1;
      local_58.i = 0;
      local_58.m.ptr = (QAbstractItemModel *)0x0;
      iVar2 = -1;
    }
    else {
      (**(code **)(*(long *)pQVar3 + 0x68))(&local_58,pQVar3,previous);
      iVar2 = local_58.r;
    }
    if ((((local_78 == iVar2) && (iStack_74 == local_58.c)) &&
        ((QModelIndex *)CONCAT44(uStack_6c,uStack_70) == (QModelIndex *)local_58.i)) &&
       (local_68 == local_58.m.ptr)) {
      pQVar3 = QAbstractItemView::model((QAbstractItemView *)this);
      cVar1 = (**(code **)(*(long *)pQVar3 + 0x88))(pQVar3,current);
      if (cVar1 != '\0') {
        pQVar3 = QAbstractItemView::model((QAbstractItemView *)this);
        cVar1 = (**(code **)(*(long *)pQVar3 + 0x88))(pQVar3,previous);
        if ((cVar1 != '\0') && ((this_00->columns).d.size != 0)) {
          uVar4 = 0;
          do {
            QAbstractItemView::rootIndex
                      (&local_58,(QAbstractItemView *)(this_00->columns).d.ptr[uVar4]);
            if (((local_78 == local_58.r) && (iStack_74 == local_58.c)) &&
               (((QModelIndex *)CONCAT44(uStack_6c,uStack_70) == (QModelIndex *)local_58.i &&
                (local_68 == local_58.m.ptr)))) {
              if ((ulong)((int)uVar4 + 1) < (ulong)(this_00->columns).d.size) goto LAB_005629c4;
              break;
            }
            uVar4 = uVar4 + 1;
          } while (uVar4 < (ulong)(this_00->columns).d.size);
        }
      }
    }
    if ((((local_78 == previous->r) && (iStack_74 == previous->c)) &&
        (CONCAT44(uStack_6c,uStack_70) == previous->i)) &&
       ((local_68 == (previous->m).ptr && ((this_00->columns).d.size != 0)))) {
      uVar4 = 0;
      do {
        QAbstractItemView::rootIndex(&local_58,(QAbstractItemView *)(this_00->columns).d.ptr[uVar4])
        ;
        if (((local_78 == local_58.r) && (iStack_74 == local_58.c)) &&
           (((QModelIndex *)CONCAT44(uStack_6c,uStack_70) == (QModelIndex *)local_58.i &&
            (local_68 == local_58.m.ptr)))) {
          if ((ulong)(this_00->columns).d.size < (ulong)((int)uVar4 + 2)) {
            QColumnViewPrivate::createColumn(this_00,current,false);
          }
          goto LAB_00562988;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < (ulong)(this_00->columns).d.size);
    }
    QColumnViewPrivate::closeColumns(this_00,current,true);
LAB_00562988:
    pQVar3 = QAbstractItemView::model((QAbstractItemView *)this);
    cVar1 = (**(code **)(*(long *)pQVar3 + 0x88))(pQVar3,current);
    if (cVar1 == '\0') {
      local_58.r = 0;
      local_58.c = 0;
      local_58.i = (quintptr)current;
      QMetaObject::activate((QObject *)this,&staticMetaObject,0,(void **)&local_58);
    }
LAB_005629c4:
    QAbstractItemView::currentChanged((QAbstractItemView *)this,current,previous);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QColumnView::currentChanged(const QModelIndex &current, const QModelIndex &previous)
{
    Q_D(QColumnView);
    if (!current.isValid()) {
        QAbstractItemView::currentChanged(current, previous);
        return;
    }

    QModelIndex currentParent = current.parent();
    // optimize for just moving up/down in a list where the child view doesn't change
    if (currentParent == previous.parent()
            && model()->hasChildren(current) && model()->hasChildren(previous)) {
        for (int i = 0; i < d->columns.size(); ++i) {
            if (currentParent == d->columns.at(i)->rootIndex()) {
                if (d->columns.size() > i + 1) {
                    QAbstractItemView::currentChanged(current, previous);
                    return;
                }
                break;
            }
        }
    }

    // Scrolling to the right we need to have an empty spot
    bool found = false;
    if (currentParent == previous) {
        for (int i = 0; i < d->columns.size(); ++i) {
            if (currentParent == d->columns.at(i)->rootIndex()) {
                found = true;
                if (d->columns.size() < i + 2) {
                    d->createColumn(current, false);
                }
                break;
            }
        }
    }
    if (!found)
        d->closeColumns(current, true);

    if (!model()->hasChildren(current))
        emit updatePreviewWidget(current);

    QAbstractItemView::currentChanged(current, previous);
}